

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O2

void printtree(Tree t)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = t.deg;
  uVar2 = 0;
  if (0 < (int)uVar3) {
    uVar2 = (ulong)uVar3;
  }
  piVar1 = &(t.branch)->n;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    printf(" %-2d:  x=%4g  y=%4g  e=%d\n",(double)((Branch *)(piVar1 + -2))->x,(double)piVar1[-1],
           uVar4 & 0xffffffff,(ulong)(uint)*piVar1);
    piVar1 = piVar1 + 3;
  }
  uVar2 = (ulong)(int)uVar3;
  piVar1 = &t.branch[uVar2].n;
  for (; (long)uVar2 < (long)(int)(uVar3 * 2 + -2); uVar2 = uVar2 + 1) {
    printf("s%-2d:  x=%4g  y=%4g  e=%d\n",(double)((Branch *)(piVar1 + -2))->x,(double)piVar1[-1],
           uVar2 & 0xffffffff,(ulong)(uint)*piVar1);
    piVar1 = piVar1 + 3;
  }
  putchar(10);
  return;
}

Assistant:

void printtree(Tree t)
{
    int i;

    for (i=0; i<t.deg; i++)
        printf(" %-2d:  x=%4g  y=%4g  e=%d\n",
               i, (float) t.branch[i].x, (float) t.branch[i].y, t.branch[i].n);
    for (i=t.deg; i<2*t.deg-2; i++)
        printf("s%-2d:  x=%4g  y=%4g  e=%d\n",
               i, (float) t.branch[i].x, (float) t.branch[i].y, t.branch[i].n);
    printf("\n");
}